

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

gdImagePtr gdImageClone(gdImagePtr src)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  gdImagePtr im;
  long lVar7;
  gdImagePtr pgVar8;
  long lVar9;
  
  if (src->trueColor == 0) {
    im = gdImageCreate(src->sx,src->sy);
  }
  else {
    im = gdImageCreateTrueColor(src->sx,src->sy);
  }
  if (im != (gdImagePtr)0x0) {
    if (src->trueColor == 0) {
      im->colorsTotal = src->colorsTotal;
      for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
        im->red[lVar7] = src->red[lVar7];
        im->green[lVar7] = src->green[lVar7];
        im->blue[lVar7] = src->blue[lVar7];
        im->alpha[lVar7] = src->alpha[lVar7];
        im->open[lVar7] = src->open[lVar7];
      }
    }
    else {
      for (lVar7 = 0; lVar7 < src->sy; lVar7 = lVar7 + 1) {
        for (lVar9 = 0; lVar9 < src->sx; lVar9 = lVar9 + 1) {
          im->tpixels[lVar7][lVar9] = src->tpixels[lVar7][lVar9];
        }
      }
    }
    if (0 < src->styleLength) {
      im->styleLength = src->styleLength;
      im->stylePos = src->stylePos;
      for (lVar7 = 0; lVar7 < src->styleLength; lVar7 = lVar7 + 1) {
        im->style[lVar7] = src->style[lVar7];
      }
    }
    im->interlace = src->interlace;
    iVar4 = src->saveAlphaFlag;
    iVar5 = src->AA;
    iVar6 = src->AA_color;
    im->alphaBlendingFlag = src->alphaBlendingFlag;
    im->saveAlphaFlag = iVar4;
    im->AA = iVar5;
    im->AA_color = iVar6;
    iVar4 = src->cx1;
    iVar5 = src->cy1;
    iVar6 = src->cx2;
    im->AA_dont_blend = src->AA_dont_blend;
    im->cx1 = iVar4;
    im->cy1 = iVar5;
    im->cx2 = iVar6;
    im->cy2 = src->cy2;
    uVar2 = src->paletteQuantizationMethod;
    uVar3 = src->paletteQuantizationSpeed;
    uVar1 = src->res_x;
    im->res_x = uVar1;
    im->res_y = uVar1;
    im->paletteQuantizationMethod = uVar2;
    im->paletteQuantizationSpeed = uVar3;
    im->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;
    im->interpolation_id = src->interpolation_id;
    im->interpolation = src->interpolation;
    if (src->brush != (gdImagePtr)0x0) {
      pgVar8 = gdImageClone(src->brush);
      im->brush = pgVar8;
    }
    if (src->tile != (gdImagePtr)0x0) {
      pgVar8 = gdImageClone(src->tile);
      im->tile = pgVar8;
    }
    if (src->style != (int *)0x0) {
      gdImageSetStyle(im,src->style,src->styleLength);
    }
    for (lVar7 = -0x400; lVar7 != 0; lVar7 = lVar7 + 4) {
      *(undefined4 *)((long)im->tileColorMap + lVar7) =
           *(undefined4 *)((long)src->tileColorMap + lVar7);
      *(undefined4 *)((long)im->alpha + lVar7 + -0x18) =
           *(undefined4 *)((long)src->alpha + lVar7 + -0x18);
    }
    if (0 < src->polyAllocated) {
      im->polyAllocated = src->polyAllocated;
      for (lVar7 = 0; lVar7 < src->polyAllocated; lVar7 = lVar7 + 1) {
        im->polyInts[lVar7] = src->polyInts[lVar7];
      }
    }
  }
  return im;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageClone (gdImagePtr src) {
	gdImagePtr dst;
	register int i, x;

	if (src->trueColor) {
		dst = gdImageCreateTrueColor(src->sx , src->sy);
	} else {
		dst = gdImageCreate(src->sx , src->sy);
	}

	if (dst == NULL) {
		return NULL;
	}

	if (src->trueColor == 0) {
		dst->colorsTotal = src->colorsTotal;
		for (i = 0; i < gdMaxColors; i++) {
			dst->red[i]   = src->red[i];
			dst->green[i] = src->green[i];
			dst->blue[i]  = src->blue[i];
			dst->alpha[i] = src->alpha[i];
			dst->open[i]  = src->open[i];
		}
		for (i = 0; i < src->sy; i++) {
			for (x = 0; x < src->sx; x++) {
				dst->pixels[i][x] = dst->pixels[i][x];
			}
		}
	} else {
		for (i = 0; i < src->sy; i++) {
			for (x = 0; x < src->sx; x++) {
				dst->tpixels[i][x] = src->tpixels[i][x];
			}
		}
	}

	if (src->styleLength > 0) {
		dst->styleLength = src->styleLength;
		dst->stylePos    = src->stylePos;
		for (i = 0; i < src->styleLength; i++) {
			dst->style[i] = src->style[i];
		}
	}

	dst->interlace   = src->interlace;

	dst->alphaBlendingFlag = src->alphaBlendingFlag;
	dst->saveAlphaFlag     = src->saveAlphaFlag;
	dst->AA                = src->AA;
	dst->AA_color          = src->AA_color;
	dst->AA_dont_blend     = src->AA_dont_blend;

	dst->cx1 = src->cx1;
	dst->cy1 = src->cy1;
	dst->cx2 = src->cx2;
	dst->cy2 = src->cy2;

	dst->res_x = src->res_x;
	dst->res_y = src->res_x;

	dst->paletteQuantizationMethod     = src->paletteQuantizationMethod;
	dst->paletteQuantizationSpeed      = src->paletteQuantizationSpeed;
	dst->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;
	dst->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;

	dst->interpolation_id = src->interpolation_id;
	dst->interpolation    = src->interpolation;

	if (src->brush) {
		dst->brush = gdImageClone(src->brush);
	}

	if (src->tile) {
		dst->tile = gdImageClone(src->tile);
	}

	if (src->style) {
		gdImageSetStyle(dst, src->style, src->styleLength);
	}

	for (i = 0; i < gdMaxColors; i++) {
		dst->brushColorMap[i] = src->brushColorMap[i];
		dst->tileColorMap[i] = src->tileColorMap[i];
	}

	if (src->polyAllocated > 0) {
		dst->polyAllocated = src->polyAllocated;
		for (i = 0; i < src->polyAllocated; i++) {
			dst->polyInts[i] = src->polyInts[i];
		}
	}

	return dst;
}